

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

int __thiscall JetHead::File::munmap(File *this,void *__addr,size_t __len)

{
  int iVar1;
  ErrCode EVar2;
  int *piVar3;
  
  if (this->mMapAddress == (uint8_t *)0x0) {
    iVar1 = 0xb;
  }
  else {
    iVar1 = ::munmap(this->mMapAddress,this->mMapLength);
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      EVar2 = getErrorCode(*piVar3);
      return EVar2;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

JetHead::ErrCode	File::munmap()
{
	if ( mMapAddress != NULL )
	{
		if ( ::munmap( mMapAddress, mMapLength ) != 0 )
			return getErrorCode( errno );
	}
	else
	{
		return JetHead::kInvalidRequest;
	}

	return JetHead::kNoError;
}